

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxfastrt.hpp
# Opt level: O1

bool __thiscall
soplex::
SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::maxShortLeave(SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *sel,int leave,
               number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *maxabs)

{
  uint *puVar1;
  double dVar2;
  bool bVar3;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  fpclass_type fVar9;
  int32_t iVar10;
  int iVar11;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar12;
  pointer pnVar13;
  cpp_dec_float<50U,_int,_void> *v_00;
  ulong uVar14;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  shortval;
  cpp_dec_float<50U,_int,_void> local_e8;
  cpp_dec_float<50U,_int,_void> local_a8;
  cpp_dec_float<50U,_int,_void> local_68;
  cpp_dec_float<50U,_int,_void> *v;
  
  peVar4 = (this->
           super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_00 = (this->
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  dVar2 = peVar4->s_epsilon_multiplier;
  uVar14 = -(ulong)(dVar2 == 1.0);
  local_68.fpclass = cpp_dec_float_finite;
  local_68.prec_elem = 10;
  local_68.data._M_elems[0] = 0;
  local_68.data._M_elems[1] = 0;
  local_68.data._M_elems[2] = 0;
  local_68.data._M_elems[3] = 0;
  local_68.data._M_elems[4] = 0;
  local_68.data._M_elems[5] = 0;
  local_68.data._M_elems._24_5_ = 0;
  local_68.data._M_elems[7]._1_3_ = 0;
  local_68.data._M_elems._32_5_ = 0;
  local_68._37_8_ = 0;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&local_68,
             (double)(~uVar14 & (ulong)(dVar2 * 1e-05) | uVar14 & 0x3ee4f8b588e368f1));
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  pnVar13 = (((this->
              super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).thesolver)->theFvec->thedelta).
            super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .val.
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  iVar11 = pnVar13[leave].m_backend.exp;
  bVar3 = pnVar13[leave].m_backend.neg;
  fVar9 = pnVar13[leave].m_backend.fpclass;
  iVar10 = pnVar13[leave].m_backend.prec_elem;
  uVar5 = *(undefined8 *)&pnVar13[leave].m_backend.data;
  uVar6 = *(undefined8 *)((long)&pnVar13[leave].m_backend.data + 8);
  puVar1 = (uint *)((long)&pnVar13[leave].m_backend.data + 0x10);
  uVar7 = *(undefined8 *)puVar1;
  uVar8 = *(undefined8 *)(puVar1 + 2);
  *(undefined8 *)((sel->m_backend).data._M_elems + 8) =
       *(undefined8 *)((long)&pnVar13[leave].m_backend.data + 0x20);
  *(undefined8 *)((sel->m_backend).data._M_elems + 4) = uVar7;
  *(undefined8 *)((sel->m_backend).data._M_elems + 6) = uVar8;
  *(undefined8 *)(sel->m_backend).data._M_elems = uVar5;
  *(undefined8 *)((sel->m_backend).data._M_elems + 2) = uVar6;
  (sel->m_backend).exp = iVar11;
  (sel->m_backend).neg = bVar3;
  (sel->m_backend).fpclass = fVar9;
  (sel->m_backend).prec_elem = iVar10;
  local_e8.fpclass = cpp_dec_float_finite;
  local_e8.prec_elem = 10;
  local_e8.data._M_elems[0] = 0;
  local_e8.data._M_elems[1] = 0;
  local_e8.data._M_elems[2] = 0;
  local_e8.data._M_elems[3] = 0;
  local_e8.data._M_elems[4] = 0;
  local_e8.data._M_elems[5] = 0;
  local_e8.data._M_elems[6] = 0;
  local_e8.data._M_elems[7] = 0;
  local_e8.data._M_elems[8] = 0;
  local_e8.data._M_elems[9] = 0;
  local_e8.exp = 0;
  local_e8.neg = false;
  if (&local_e8 != &maxabs->m_backend) {
    uVar5 = *(undefined8 *)((maxabs->m_backend).data._M_elems + 8);
    local_e8.data._M_elems[8] = (uint)uVar5;
    local_e8.data._M_elems[9] = (uint)((ulong)uVar5 >> 0x20);
    uVar5 = *(undefined8 *)(maxabs->m_backend).data._M_elems;
    uVar6 = *(undefined8 *)((maxabs->m_backend).data._M_elems + 2);
    uVar7 = *(undefined8 *)((maxabs->m_backend).data._M_elems + 4);
    uVar8 = *(undefined8 *)((maxabs->m_backend).data._M_elems + 6);
    local_e8.data._M_elems[4] = (uint)uVar7;
    local_e8.data._M_elems[5] = (uint)((ulong)uVar7 >> 0x20);
    local_e8.data._M_elems[6] = (uint)uVar8;
    local_e8.data._M_elems[7] = (uint)((ulong)uVar8 >> 0x20);
    local_e8.data._M_elems[0] = (uint)uVar5;
    local_e8.data._M_elems[1] = (uint)((ulong)uVar5 >> 0x20);
    local_e8.data._M_elems[2] = (uint)uVar6;
    local_e8.data._M_elems[3] = (uint)((ulong)uVar6 >> 0x20);
    local_e8.exp = (maxabs->m_backend).exp;
    local_e8.neg = (maxabs->m_backend).neg;
    local_e8.fpclass = (maxabs->m_backend).fpclass;
    local_e8.prec_elem = (maxabs->m_backend).prec_elem;
  }
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(&local_e8,&local_68);
  if ((((sel->m_backend).fpclass == cpp_dec_float_NaN) || (local_e8.fpclass == cpp_dec_float_NaN))
     || (iVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                            (&sel->m_backend,&local_e8), iVar11 < 1)) {
    local_e8.data._M_elems[0] = (maxabs->m_backend).data._M_elems[0];
    local_e8.exp = (maxabs->m_backend).exp;
    local_e8.data._M_elems[9] = (maxabs->m_backend).data._M_elems[9];
    uVar5 = *(undefined8 *)((maxabs->m_backend).data._M_elems + 1);
    uVar6 = *(undefined8 *)((maxabs->m_backend).data._M_elems + 3);
    uVar7 = *(undefined8 *)((maxabs->m_backend).data._M_elems + 5);
    uVar8 = *(undefined8 *)((maxabs->m_backend).data._M_elems + 7);
    local_e8.data._M_elems[5] = (uint)uVar7;
    local_e8.data._M_elems[6] = (uint)((ulong)uVar7 >> 0x20);
    local_e8.data._M_elems[7] = (uint)uVar8;
    local_e8.data._M_elems[8] = (uint)((ulong)uVar8 >> 0x20);
    local_e8.data._M_elems[1] = (uint)uVar5;
    local_e8.data._M_elems[2] = (uint)((ulong)uVar5 >> 0x20);
    local_e8.data._M_elems[3] = (uint)uVar6;
    local_e8.data._M_elems[4] = (uint)((ulong)uVar6 >> 0x20);
    local_e8.fpclass = (maxabs->m_backend).fpclass;
    local_e8.prec_elem = (maxabs->m_backend).prec_elem;
    local_e8.neg = (bool)((local_e8.data._M_elems[0] != 0 ||
                          local_e8.fpclass != cpp_dec_float_finite) ^ (maxabs->m_backend).neg);
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(&local_e8,&local_68);
    if ((((sel->m_backend).fpclass == cpp_dec_float_NaN) || (local_e8.fpclass == cpp_dec_float_NaN))
       || (iVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                              (&sel->m_backend,&local_e8), -1 < iVar11)) {
      return false;
    }
    pSVar12 = (this->
              super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).thesolver;
    pnVar13 = (pSVar12->theLBbound).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  }
  else {
    pSVar12 = (this->
              super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).thesolver;
    pnVar13 = (pSVar12->theUBbound).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  }
  v = &pnVar13[leave].m_backend;
  v_00 = &(pSVar12->theFvec->
          super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).val.
          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._M_impl.super__Vector_impl_data._M_start[leave].m_backend;
  local_a8.fpclass = cpp_dec_float_finite;
  local_a8.prec_elem = 10;
  local_a8.data._M_elems[0] = 0;
  local_a8.data._M_elems[1] = 0;
  local_a8.data._M_elems[2] = 0;
  local_a8.data._M_elems[3] = 0;
  local_a8.data._M_elems[4] = 0;
  local_a8.data._M_elems[5] = 0;
  local_a8.data._M_elems._24_5_ = 0;
  local_a8.data._M_elems[7]._1_3_ = 0;
  local_a8.data._M_elems._32_5_ = 0;
  local_a8.data._M_elems[9]._1_3_ = 0;
  local_a8.exp = 0;
  local_a8.neg = false;
  if (&local_a8 == v_00) {
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=(&local_a8,v);
    if (local_a8.data._M_elems[0] != 0 || local_a8.fpclass != cpp_dec_float_finite) {
      local_a8.neg = (bool)(local_a8.neg ^ 1);
    }
  }
  else {
    if (&local_a8 != v) {
      uVar5 = *(undefined8 *)((v->data)._M_elems + 8);
      local_a8.data._M_elems._32_5_ = SUB85(uVar5,0);
      local_a8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
      local_a8.data._M_elems._0_8_ = *(undefined8 *)(v->data)._M_elems;
      local_a8.data._M_elems._8_8_ = *(undefined8 *)((v->data)._M_elems + 2);
      local_a8.data._M_elems._16_8_ = *(undefined8 *)((v->data)._M_elems + 4);
      uVar5 = *(undefined8 *)((v->data)._M_elems + 6);
      local_a8.data._M_elems._24_5_ = SUB85(uVar5,0);
      local_a8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
      local_a8.exp = v->exp;
      local_a8.neg = v->neg;
      local_a8.fpclass = v->fpclass;
      local_a8.prec_elem = v->prec_elem;
    }
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=(&local_a8,v_00);
  }
  local_e8.fpclass = cpp_dec_float_finite;
  local_e8.prec_elem = 10;
  local_e8.data._M_elems[0] = 0;
  local_e8.data._M_elems[1] = 0;
  local_e8.data._M_elems[2] = 0;
  local_e8.data._M_elems[3] = 0;
  local_e8.data._M_elems[4] = 0;
  local_e8.data._M_elems[5] = 0;
  local_e8.data._M_elems[6] = 0;
  local_e8.data._M_elems[7] = 0;
  local_e8.data._M_elems[8] = 0;
  local_e8.data._M_elems[9] = 0;
  local_e8.exp = 0;
  local_e8.neg = false;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            (&local_e8,&local_a8,&sel->m_backend);
  *(ulong *)((sel->m_backend).data._M_elems + 8) =
       CONCAT44(local_e8.data._M_elems[9],local_e8.data._M_elems[8]);
  *(ulong *)((sel->m_backend).data._M_elems + 4) =
       CONCAT44(local_e8.data._M_elems[5],local_e8.data._M_elems[4]);
  *(ulong *)((sel->m_backend).data._M_elems + 6) =
       CONCAT44(local_e8.data._M_elems[7],local_e8.data._M_elems[6]);
  *(ulong *)(sel->m_backend).data._M_elems =
       CONCAT44(local_e8.data._M_elems[1],local_e8.data._M_elems[0]);
  *(ulong *)((sel->m_backend).data._M_elems + 2) =
       CONCAT44(local_e8.data._M_elems[3],local_e8.data._M_elems[2]);
  (sel->m_backend).exp = local_e8.exp;
  (sel->m_backend).neg = local_e8.neg;
  (sel->m_backend).fpclass = local_e8.fpclass;
  (sel->m_backend).prec_elem = local_e8.prec_elem;
  return true;
}

Assistant:

bool SPxFastRT<R>::maxShortLeave(R& sel, int leave, R maxabs)
{
   assert(leave >= 0);
   assert(maxabs >= 0);

   R shortval = this->tolerances()->scaleAccordingToEpsilon(SOPLEX_SHORTVAL);

   sel = this->thesolver->fVec().delta()[leave];

   if(sel > maxabs * shortval)
   {
      sel = (this->thesolver->ubBound()[leave] - this->thesolver->fVec()[leave]) / sel;
      return true;
   }

   if(sel < -maxabs * shortval)
   {
      sel = (this->thesolver->lbBound()[leave] - this->thesolver->fVec()[leave]) / sel;
      return true;
   }

   return false;
}